

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdqsort.h
# Opt level: O1

void __thiscall
pdqsort_detail::
sort3<__gnu_cxx::__normal_iterator<FractionalInteger*,std::vector<FractionalInteger,std::allocator<FractionalInteger>>>,HighsTableauSeparator::separateLpSolution(HighsLpRelaxation&,HighsLpAggregator&,HighsTransformedLp&,HighsCutPool&)::__0>
          (pdqsort_detail *this,
          __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
          a,__normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
            b,__normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
              c,anon_class_16_2_a9e7a8bd comp)

{
  undefined8 uVar1;
  pointer ppVar2;
  pointer ppVar3;
  undefined1 auVar4 [16];
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  HighsInt HVar8;
  double dVar9;
  double dVar10;
  pointer ppVar11;
  pointer ppVar12;
  double dVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  double **ppdVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined4 local_5c;
  undefined4 uStack_58;
  
  ppdVar18 = comp.edgeWt;
  auVar19._0_8_ = (1.0 - *(double *)this) * *(double *)this;
  auVar19._8_8_ = (1.0 - (a._M_current)->fractionality) * (a._M_current)->fractionality;
  uVar1 = *(undefined8 *)
           ((long)(c._M_current)->fractionality + (long)(a._M_current)->basisIndex * 8);
  auVar20._8_4_ = (int)uVar1;
  auVar20._0_8_ =
       *(undefined8 *)((long)(c._M_current)->fractionality + (long)*(int *)(this + 0x18) * 8);
  auVar20._12_4_ = (int)((ulong)uVar1 >> 0x20);
  auVar20 = divpd(auVar19,auVar20);
  if ((auVar20._0_8_ < auVar20._8_8_) ||
     ((auVar20._0_8_ <= auVar20._8_8_ &&
      (uVar15 = (long)*(int *)(this + 0x18) + (long)ppdVar18[3], uVar17 = uVar15 >> 0x20,
      uVar15 = uVar15 & 0xffffffff, uVar14 = (long)(a._M_current)->basisIndex + (long)ppdVar18[3],
      uVar16 = uVar14 >> 0x20, uVar14 = uVar14 & 0xffffffff,
      ((uVar15 + 0x42d8680e260ae5b) * (uVar17 + 0x8a183895eeac1536) ^
      (uVar17 + 0x80c8963be3e4c2f3) * (uVar15 + 0xc8497d2a400d9551) >> 0x20) <
      ((uVar14 + 0x42d8680e260ae5b) * (uVar16 + 0x8a183895eeac1536) ^
      (uVar16 + 0x80c8963be3e4c2f3) * (uVar14 + 0xc8497d2a400d9551) >> 0x20))))) {
    dVar9 = *(double *)this;
    dVar10 = *(double *)(this + 8);
    uVar1 = *(undefined8 *)(this + 0x14);
    uStack_58 = (undefined4)((ulong)*(undefined8 *)(this + 0xc) >> 0x20);
    local_5c = (undefined4)((ulong)dVar10 >> 0x20);
    ppVar2 = *(pointer *)(this + 0x30);
    ppVar11 = *(pointer *)(this + 0x20);
    ppVar12 = *(pointer *)(this + 0x28);
    *(undefined8 *)(this + 0x20) = 0;
    *(undefined8 *)(this + 0x28) = 0;
    *(undefined8 *)(this + 0x30) = 0;
    dVar13 = (a._M_current)->row_ep_norm2;
    uVar5 = *(undefined4 *)((long)&(a._M_current)->row_ep_norm2 + 4);
    uVar6 = *(undefined4 *)&(a._M_current)->score;
    uVar7 = *(undefined4 *)((long)&(a._M_current)->score + 4);
    HVar8 = (a._M_current)->basisIndex;
    *(double *)this = (a._M_current)->fractionality;
    *(double *)(this + 8) = dVar13;
    *(undefined4 *)(this + 0xc) = uVar5;
    *(undefined4 *)(this + 0x10) = uVar6;
    *(undefined4 *)(this + 0x14) = uVar7;
    *(HighsInt *)(this + 0x18) = HVar8;
    std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::_M_move_assign
              ((vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
               (this + 0x20),&(a._M_current)->row_ep);
    *(ulong *)((long)&(a._M_current)->row_ep_norm2 + 4) = CONCAT44(uStack_58,local_5c);
    *(undefined8 *)((long)&(a._M_current)->score + 4) = uVar1;
    (a._M_current)->fractionality = dVar9;
    (a._M_current)->row_ep_norm2 = dVar10;
    ppVar3 = ((a._M_current)->row_ep).
             super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
    ((a._M_current)->row_ep).
    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl.
    super__Vector_impl_data._M_start = ppVar11;
    ((a._M_current)->row_ep).
    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl.
    super__Vector_impl_data._M_finish = ppVar12;
    ((a._M_current)->row_ep).
    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = ppVar2;
    if (ppVar3 != (pointer)0x0) {
      operator_delete(ppVar3);
    }
  }
  auVar21._0_8_ = (1.0 - (a._M_current)->fractionality) * (a._M_current)->fractionality;
  auVar21._8_8_ = (1.0 - (b._M_current)->fractionality) * (b._M_current)->fractionality;
  uVar1 = *(undefined8 *)
           ((long)(c._M_current)->fractionality + (long)(b._M_current)->basisIndex * 8);
  auVar4._8_4_ = (int)uVar1;
  auVar4._0_8_ = *(undefined8 *)
                  ((long)(c._M_current)->fractionality + (long)(a._M_current)->basisIndex * 8);
  auVar4._12_4_ = (int)((ulong)uVar1 >> 0x20);
  auVar20 = divpd(auVar21,auVar4);
  if ((auVar20._0_8_ < auVar20._8_8_) ||
     ((auVar20._0_8_ <= auVar20._8_8_ &&
      (uVar15 = (long)(a._M_current)->basisIndex + (long)ppdVar18[3], uVar17 = uVar15 >> 0x20,
      uVar15 = uVar15 & 0xffffffff, uVar14 = (long)(b._M_current)->basisIndex + (long)ppdVar18[3],
      uVar16 = uVar14 >> 0x20, uVar14 = uVar14 & 0xffffffff,
      ((uVar15 + 0x42d8680e260ae5b) * (uVar17 + 0x8a183895eeac1536) ^
      (uVar17 + 0x80c8963be3e4c2f3) * (uVar15 + 0xc8497d2a400d9551) >> 0x20) <
      ((uVar14 + 0x42d8680e260ae5b) * (uVar16 + 0x8a183895eeac1536) ^
      (uVar16 + 0x80c8963be3e4c2f3) * (uVar14 + 0xc8497d2a400d9551) >> 0x20))))) {
    dVar9 = (a._M_current)->fractionality;
    dVar10 = (a._M_current)->row_ep_norm2;
    uVar1 = *(undefined8 *)((long)&(a._M_current)->score + 4);
    uStack_58 = (undefined4)
                ((ulong)*(undefined8 *)((long)&(a._M_current)->row_ep_norm2 + 4) >> 0x20);
    local_5c = (undefined4)((ulong)dVar10 >> 0x20);
    ppVar2 = ((a._M_current)->row_ep).
             super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
    ppVar11 = ((a._M_current)->row_ep).
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_start;
    ppVar12 = ((a._M_current)->row_ep).
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    ((a._M_current)->row_ep).
    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    ((a._M_current)->row_ep).
    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    ((a._M_current)->row_ep).
    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    dVar13 = (b._M_current)->row_ep_norm2;
    uVar5 = *(undefined4 *)((long)&(b._M_current)->row_ep_norm2 + 4);
    uVar6 = *(undefined4 *)&(b._M_current)->score;
    uVar7 = *(undefined4 *)((long)&(b._M_current)->score + 4);
    HVar8 = (b._M_current)->basisIndex;
    (a._M_current)->fractionality = (b._M_current)->fractionality;
    (a._M_current)->row_ep_norm2 = dVar13;
    *(undefined4 *)((long)&(a._M_current)->row_ep_norm2 + 4) = uVar5;
    *(undefined4 *)&(a._M_current)->score = uVar6;
    *(undefined4 *)((long)&(a._M_current)->score + 4) = uVar7;
    (a._M_current)->basisIndex = HVar8;
    std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::_M_move_assign
              (&(a._M_current)->row_ep,&(b._M_current)->row_ep);
    *(ulong *)((long)&(b._M_current)->row_ep_norm2 + 4) = CONCAT44(uStack_58,local_5c);
    *(undefined8 *)((long)&(b._M_current)->score + 4) = uVar1;
    (b._M_current)->fractionality = dVar9;
    (b._M_current)->row_ep_norm2 = dVar10;
    ppVar3 = ((b._M_current)->row_ep).
             super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
    ((b._M_current)->row_ep).
    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl.
    super__Vector_impl_data._M_start = ppVar11;
    ((b._M_current)->row_ep).
    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl.
    super__Vector_impl_data._M_finish = ppVar12;
    ((b._M_current)->row_ep).
    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = ppVar2;
    if (ppVar3 != (pointer)0x0) {
      operator_delete(ppVar3);
    }
  }
  auVar23._0_8_ = (1.0 - *(double *)this) * *(double *)this;
  auVar23._8_8_ = (1.0 - (a._M_current)->fractionality) * (a._M_current)->fractionality;
  auVar22._8_8_ =
       *(undefined8 *)((long)(c._M_current)->fractionality + (long)(a._M_current)->basisIndex * 8);
  auVar22._0_8_ =
       *(undefined8 *)((long)(c._M_current)->fractionality + (long)*(int *)(this + 0x18) * 8);
  auVar20 = divpd(auVar23,auVar22);
  if ((auVar20._0_8_ < auVar20._8_8_) ||
     ((auVar20._0_8_ <= auVar20._8_8_ &&
      (uVar15 = (long)*(int *)(this + 0x18) + (long)ppdVar18[3], uVar17 = uVar15 >> 0x20,
      uVar15 = uVar15 & 0xffffffff, uVar14 = (long)(a._M_current)->basisIndex + (long)ppdVar18[3],
      uVar16 = uVar14 >> 0x20, uVar14 = uVar14 & 0xffffffff,
      ((uVar15 + 0x42d8680e260ae5b) * (uVar17 + 0x8a183895eeac1536) ^
      (uVar17 + 0x80c8963be3e4c2f3) * (uVar15 + 0xc8497d2a400d9551) >> 0x20) <
      ((uVar14 + 0x42d8680e260ae5b) * (uVar16 + 0x8a183895eeac1536) ^
      (uVar14 + 0xc8497d2a400d9551) * (uVar16 + 0x80c8963be3e4c2f3) >> 0x20))))) {
    dVar9 = *(double *)this;
    dVar10 = *(double *)(this + 8);
    uVar1 = *(undefined8 *)(this + 0x14);
    uStack_58 = (undefined4)((ulong)*(undefined8 *)(this + 0xc) >> 0x20);
    local_5c = (undefined4)((ulong)dVar10 >> 0x20);
    ppVar2 = *(pointer *)(this + 0x30);
    ppVar11 = *(pointer *)(this + 0x20);
    ppVar12 = *(pointer *)(this + 0x28);
    *(undefined8 *)(this + 0x20) = 0;
    *(undefined8 *)(this + 0x28) = 0;
    *(undefined8 *)(this + 0x30) = 0;
    dVar13 = (a._M_current)->row_ep_norm2;
    uVar5 = *(undefined4 *)((long)&(a._M_current)->row_ep_norm2 + 4);
    uVar6 = *(undefined4 *)&(a._M_current)->score;
    uVar7 = *(undefined4 *)((long)&(a._M_current)->score + 4);
    HVar8 = (a._M_current)->basisIndex;
    *(double *)this = (a._M_current)->fractionality;
    *(double *)(this + 8) = dVar13;
    *(undefined4 *)(this + 0xc) = uVar5;
    *(undefined4 *)(this + 0x10) = uVar6;
    *(undefined4 *)(this + 0x14) = uVar7;
    *(HighsInt *)(this + 0x18) = HVar8;
    std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::_M_move_assign
              ((vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
               (this + 0x20),&(a._M_current)->row_ep);
    *(ulong *)((long)&(a._M_current)->row_ep_norm2 + 4) = CONCAT44(uStack_58,local_5c);
    *(undefined8 *)((long)&(a._M_current)->score + 4) = uVar1;
    (a._M_current)->fractionality = dVar9;
    (a._M_current)->row_ep_norm2 = dVar10;
    ppVar3 = ((a._M_current)->row_ep).
             super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
    ((a._M_current)->row_ep).
    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl.
    super__Vector_impl_data._M_start = ppVar11;
    ((a._M_current)->row_ep).
    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl.
    super__Vector_impl_data._M_finish = ppVar12;
    ((a._M_current)->row_ep).
    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = ppVar2;
    if (ppVar3 != (pointer)0x0) {
      operator_delete(ppVar3);
    }
  }
  return;
}

Assistant:

inline void sort3(Iter a, Iter b, Iter c, Compare comp) {
        sort2(a, b, comp);
        sort2(b, c, comp);
        sort2(a, b, comp);
    }